

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O3

void testAttrFloatVectors(string *tempdir)

{
  exr_result_t eVar1;
  exr_context_t p_Var2;
  void *pvVar3;
  undefined8 *puVar4;
  ostream *poVar5;
  char *pcVar6;
  size_t sVar7;
  char *in_RCX;
  char *pcVar8;
  float *outp;
  exr_context_t f;
  exr_context_t local_20;
  
  p_Var2 = createDummyFile("<floatvector>");
  local_20 = p_Var2;
  if (p_Var2 == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    eVar1 = (*p_Var2->report_error)
                      (p_Var2,3,"Invalid reference to float vector object to initialize");
    if (eVar1 == 3) {
      pcVar8 = (char *)0xfffffffc;
      eVar1 = (*p_Var2->print_error)
                        (p_Var2,3,
                         "Received request to allocate negative sized float vector (%d entries)");
      if (eVar1 != 3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
        pcVar6 = (char *)exr_get_default_error_message(eVar1);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n    expected: (",0x10);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
        pcVar6 = (char *)exr_get_default_error_message(3);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        core_test_fail("exr_attr_float_vector_init (f, &fv, -4)",(char *)0x1d4,0x34647e,pcVar8);
      }
      eVar1 = (*p_Var2->report_error)(p_Var2,3,"Invalid (NULL) arguments to float vector create");
      if (eVar1 != 3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
        pcVar6 = (char *)exr_get_default_error_message(eVar1);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n    expected: (",0x10);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
        pcVar6 = (char *)exr_get_default_error_message(3);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        core_test_fail("exr_attr_float_vector_create (f, __null, fdata, 4)",(char *)0x1d7,0x34647e,
                       pcVar8);
      }
      eVar1 = (*p_Var2->report_error)(p_Var2,3,"Invalid (NULL) arguments to float vector create");
      if (eVar1 != 3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
        pcVar6 = (char *)exr_get_default_error_message(eVar1);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n    expected: (",0x10);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
        pcVar6 = (char *)exr_get_default_error_message(3);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        core_test_fail("exr_attr_float_vector_create (f, &fv, __null, 4)",(char *)0x1da,0x34647e,
                       pcVar8);
      }
      pcVar8 = (char *)0xfffffffc;
      eVar1 = (*p_Var2->print_error)
                        (p_Var2,3,
                         "Received request to allocate negative sized float vector (%d entries)");
      if (eVar1 != 3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
        pcVar6 = (char *)exr_get_default_error_message(eVar1);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n    expected: (",0x10);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
        pcVar6 = (char *)exr_get_default_error_message(3);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        core_test_fail("exr_attr_float_vector_create (f, &fv, fdata, -4)",(char *)0x1dd,0x34647e,
                       pcVar8);
      }
      pcVar8 = (char *)0x3fffffff;
      eVar1 = (*p_Var2->print_error)
                        (p_Var2,3,"Invalid too large size for float vector (%d entries)");
      if (eVar1 != 3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
        pcVar6 = (char *)exr_get_default_error_message(eVar1);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n    expected: (",0x10);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
        pcVar6 = (char *)exr_get_default_error_message(3);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        core_test_fail("exr_attr_float_vector_create (f, &fv, fdata, (2147483647) / 2)",
                       (char *)0x1e3,0x34647e,pcVar8);
      }
      eVar1 = (*p_Var2->report_error)
                        (p_Var2,3,"Invalid reference to float vector object to initialize");
      if (eVar1 != 3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
        pcVar6 = (char *)exr_get_default_error_message(eVar1);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n    expected: (",0x10);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
        pcVar6 = (char *)exr_get_default_error_message(3);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        core_test_fail("exr_attr_float_vector_init_static (f, __null, fdata, 4)",(char *)0x1e6,
                       0x34647e,pcVar8);
      }
      eVar1 = (*p_Var2->report_error)
                        (p_Var2,3,"Invalid reference to float array object to initialize");
      if (eVar1 != 3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
        pcVar6 = (char *)exr_get_default_error_message(eVar1);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n    expected: (",0x10);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
        pcVar6 = (char *)exr_get_default_error_message(3);
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
        }
        else {
          sVar7 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        core_test_fail("exr_attr_float_vector_init_static (f, &fv, __null, 4)",(char *)0x1e9,
                       0x34647e,pcVar8);
      }
      pcVar8 = (char *)0xfffffffc;
      eVar1 = (*p_Var2->print_error)
                        (p_Var2,3,
                         "Received request to allocate negative sized float vector (%d entries)");
      if (eVar1 == 3) {
        pvVar3 = (*p_Var2->alloc_fn)(0x10);
        if (pvVar3 == (void *)0x0) {
          eVar1 = (*p_Var2->standard_error)(p_Var2,1);
          if (eVar1 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Return Error: (",0xf);
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
            pcVar6 = (char *)exr_get_default_error_message(eVar1);
            if (pcVar6 == (char *)0x0) {
              std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
            }
            else {
              sVar7 = strlen(pcVar6);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            core_test_fail("exr_attr_float_vector_init (f, &fv, 4)",(char *)0x1f3,0x34647e,pcVar8);
          }
          core_test_fail("fv.length == 4",(char *)0x1f4,0x34647e,pcVar8);
        }
        (*p_Var2->free_fn)(pvVar3);
        puVar4 = (undefined8 *)(*p_Var2->alloc_fn)(0x10);
        if (puVar4 != (undefined8 *)0x0) {
          *puVar4 = 0x400000003f800000;
          puVar4[1] = 0x4080000040400000;
          (*p_Var2->free_fn)(puVar4);
          s_malloc_fail_on = 1;
          puVar4 = (undefined8 *)(*p_Var2->alloc_fn)(0x10);
          if ((puVar4 == (undefined8 *)0x0) &&
             (eVar1 = (*p_Var2->standard_error)(p_Var2,1), eVar1 != 0)) {
            s_malloc_fail_on = 0;
            if (eVar1 == 1) {
              exr_print_context_info(p_Var2,0);
              exr_print_context_info(p_Var2,1);
              exr_finish(&local_20);
              return;
            }
          }
          else {
            *puVar4 = 0x400000003f800000;
            puVar4[1] = 0x4080000040400000;
            eVar1 = 0;
          }
          s_malloc_fail_on = 0;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
          pcVar6 = (char *)exr_get_default_error_message(eVar1);
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
          }
          else {
            sVar7 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n    expected: (",0x10);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
          pcVar6 = (char *)exr_get_default_error_message(1);
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
          }
          else {
            sVar7 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          core_test_fail("exr_attr_float_vector_create (f, &fv, fdata, 4)",(char *)0x206,0x34647e,
                         pcVar8);
        }
        eVar1 = (*p_Var2->standard_error)(p_Var2,1);
        if (eVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
          pcVar6 = (char *)exr_get_default_error_message(eVar1);
          if (pcVar6 == (char *)0x0) {
            std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
          }
          else {
            sVar7 = strlen(pcVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          core_test_fail("exr_attr_float_vector_create (f, &fv, fdata, 4)",(char *)0x1fc,0x34647e,
                         pcVar8);
        }
        _DAT_00000000 = 0x400000003f800000;
        uRam0000000000000008 = 0x4080000040400000;
        core_test_fail("fv.length == 4",(char *)0x1fd,0x34647e,pcVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(eVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
      }
      else {
        sVar7 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n    expected: (",0x10);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(3);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
      }
      else {
        sVar7 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar6,sVar7);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      core_test_fail("exr_attr_float_vector_init_static (f, &fv, fdata, -4)",(char *)0x1ec,0x34647e,
                     pcVar8);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,eVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
  pcVar8 = (char *)exr_get_default_error_message(eVar1);
  if (pcVar8 == (char *)0x0) {
    std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
  }
  else {
    sVar7 = strlen(pcVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n    expected: (",0x10);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
  pcVar8 = (char *)exr_get_default_error_message(3);
  if (pcVar8 == (char *)0x0) {
    std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
  }
  else {
    sVar7 = strlen(pcVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,sVar7);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  core_test_fail("exr_attr_float_vector_init (f, __null, 4)",(char *)0x1d0,0x34647e,in_RCX);
}

Assistant:

void
testAttrFloatVectors (const std::string& tempdir)
{
    // we no longer allow a null context as we need the memory allocator
    //testFloatVectorHelper (NULL);
    exr_context_t f = createDummyFile ("<floatvector>");
    testFloatVectorHelper (f);
    exr_print_context_info (f, 0);
    exr_print_context_info (f, 1);
    exr_finish (&f);
}